

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint8x16OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDUint8x16Operation::OpShiftRightByScalar(SIMDValue *value,int count)

{
  undefined1 uVar1;
  uint32 uVar2;
  ulong uVar3;
  _x86_SIMDValue _Var4;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar5;
  __m128i mask;
  __m128i x86tmp1;
  X86SIMDValue tmpaValue;
  X86SIMDValue x86Result;
  byte local_8c;
  int count_local;
  SIMDValue *value_local;
  undefined1 local_4c [20];
  ushort local_38;
  ushort uStack_36;
  ushort uStack_34;
  ushort uStack_32;
  
  tmpaValue.field_0.f64[1] = 0.0;
  _Var4 = _x86_SIMDValue::ToX86SIMDValue(value);
  uVar2 = SIMDUtils::SIMDGetShiftAmountMask(1);
  local_8c = (byte)(count & uVar2);
  uVar1 = (undefined1)(0xff >> (local_8c & 0x1f));
  local_4c._0_3_ = CONCAT21(CONCAT11(uVar1,uVar1),uVar1);
  local_38 = _Var4.field_0._0_2_;
  uStack_36 = _Var4.field_0._2_2_;
  uStack_34 = _Var4.field_0._4_2_;
  uStack_32 = _Var4.field_0._6_2_;
  uVar3 = (ulong)(count & uVar2);
  tmpaValue.field_0.i64[1] =
       CONCAT26(uStack_32 >> uVar3,
                CONCAT24(uStack_34 >> uVar3,CONCAT22(uStack_36 >> uVar3,local_38 >> uVar3))) &
       CONCAT17(uVar1,CONCAT16(uVar1,CONCAT15(uVar1,CONCAT14(uVar1,CONCAT13(uVar1,local_4c._0_3_))))
               );
  aVar5 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&tmpaValue.field_0 + 8));
  return (SIMDValue)aVar5;
}

Assistant:

SIMDValue SIMDUint8x16Operation::OpShiftRightByScalar(const SIMDValue& value, int count)
    {
        X86SIMDValue x86Result = { { 0, 0, 0, 0} };
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(value);
        __m128i x86tmp1;

        count = count & SIMDUtils::SIMDGetShiftAmountMask(1);

       __m128i mask = _mm_set1_epi8((unsigned char)0xff >> count);
        x86tmp1 = _mm_srli_epi16(tmpaValue.m128i_value, count);
        x86Result.m128i_value = _mm_and_si128(x86tmp1, mask);
       
        return X86SIMDValue::ToSIMDValue(x86Result);
    }